

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::Texture3DSpecCase::verifyTexture
          (Texture3DSpecCase *this,GLContext *gles3Context,ReferenceContext *refContext)

{
  Surface *dst_00;
  bool bVar1;
  DataType samplerType;
  int width;
  int height;
  int iVar2;
  RenderTarget *this_00;
  PixelFormat *pixelFormat;
  TestLog *log;
  char *imageSetName;
  char *imageSetDesc;
  bool local_479;
  uint local_43c;
  GLContext *local_438;
  GLContext *local_418;
  ConstPixelBufferAccess local_3f0;
  ConstPixelBufferAccess local_3c8;
  undefined1 local_39a;
  allocator<char> local_399;
  undefined1 local_398 [6];
  bool depthOk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [8];
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  string name;
  string sliceStr;
  string levelStr;
  undefined1 local_244 [8];
  UVec4 threshold;
  deUint32 shaderID;
  Context *ctx_1;
  Surface *dst;
  undefined1 local_218 [4];
  int ndx_1;
  Surface result;
  Surface reference;
  int depth;
  bool levelOk;
  int levelD;
  int levelH;
  int levelW;
  int levelNdx;
  Context *ctx;
  uint local_1c0;
  int ndx;
  deUint32 shaderIDRef;
  uint local_1ac;
  TextureFormat TStack_1a8;
  deUint32 shaderIDgles;
  undefined1 local_1a0 [8];
  Texture3DShader shader;
  ReferenceContext *refContext_local;
  GLContext *gles3Context_local;
  Texture3DSpecCase *this_local;
  
  TStack_1a8 = this->m_texFormat;
  shader._376_8_ = refContext;
  samplerType = glu::getSampler3DType(TStack_1a8);
  FboTestUtil::Texture3DShader::Texture3DShader
            ((Texture3DShader *)local_1a0,samplerType,TYPE_FLOAT_VEC4);
  local_1ac = (*(gles3Context->super_Context)._vptr_Context[0x75])
                        (gles3Context,(Texture3DShader *)local_1a0);
  local_1c0 = (**(code **)(*(long *)shader._376_8_ + 0x3a8))(shader._376_8_,local_1a0);
  FboTestUtil::Texture3DShader::setTexScaleBias
            ((Texture3DShader *)local_1a0,&(this->m_texFormatInfo).lookupScale,
             &(this->m_texFormatInfo).lookupBias);
  for (ctx._4_4_ = 0; ctx._4_4_ < 2; ctx._4_4_ = ctx._4_4_ + 1) {
    local_418 = gles3Context;
    if (ctx._4_4_ != 0) {
      local_418 = (GLContext *)shader._376_8_;
    }
    _levelW = local_418;
    sglr::ContextWrapper::setContext
              (&(this->super_TextureSpecCase).super_ContextWrapper,&local_418->super_Context);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_TextureSpecCase).super_ContextWrapper,0x806f,0x2801,0x2700);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_TextureSpecCase).super_ContextWrapper,0x806f,0x2800,0x2600);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_TextureSpecCase).super_ContextWrapper,0x806f,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_TextureSpecCase).super_ContextWrapper,0x806f,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_TextureSpecCase).super_ContextWrapper,0x806f,0x8072,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_TextureSpecCase).super_ContextWrapper,0x806f,0x813d,
               this->m_numLevels + -1);
  }
  for (levelH = 0; levelH < this->m_numLevels; levelH = levelH + 1) {
    width = de::max<int>(1,this->m_width >> ((byte)levelH & 0x1f));
    height = de::max<int>(1,this->m_height >> ((byte)levelH & 0x1f));
    iVar2 = de::max<int>(1,this->m_depth >> ((byte)levelH & 0x1f));
    reference.m_pixels.m_cap._7_1_ = 1;
    for (reference.m_pixels.m_cap._0_4_ = 0; (int)reference.m_pixels.m_cap < iVar2;
        reference.m_pixels.m_cap._0_4_ = (int)reference.m_pixels.m_cap + 1) {
      tcu::Surface::Surface((Surface *)&result.m_pixels.m_cap);
      tcu::Surface::Surface((Surface *)local_218);
      FboTestUtil::Texture3DShader::setDepth
                ((Texture3DShader *)local_1a0,
                 ((float)(int)reference.m_pixels.m_cap + 0.5) / (float)iVar2);
      for (dst._4_4_ = 0; dst._4_4_ < 2; dst._4_4_ = dst._4_4_ + 1) {
        if (dst._4_4_ == 0) {
          dst_00 = (Surface *)local_218;
          local_438 = gles3Context;
        }
        else {
          dst_00 = (Surface *)&result.m_pixels.m_cap;
          local_438 = (GLContext *)shader._376_8_;
        }
        stack0xfffffffffffffdd0 = local_438;
        if (dst._4_4_ == 0) {
          local_43c = local_1ac;
        }
        else {
          local_43c = local_1c0;
        }
        threshold.m_data[2] = local_43c;
        sglr::ContextWrapper::setContext
                  (&(this->super_TextureSpecCase).super_ContextWrapper,&local_438->super_Context);
        FboTestUtil::Texture3DShader::setUniforms
                  ((Texture3DShader *)local_1a0,&stack0xfffffffffffffdd0->super_Context,
                   threshold.m_data[2]);
        TextureSpecCase::renderTex
                  (&this->super_TextureSpecCase,dst_00,threshold.m_data[2],width,height);
      }
      this_00 = gles3::Context::getRenderTarget
                          ((this->super_TextureSpecCase).super_TestCase.m_context);
      pixelFormat = tcu::RenderTarget::getPixelFormat(this_00);
      computeCompareThreshold((Functional *)local_244,pixelFormat,this->m_texFormat);
      de::toString<int>((string *)((long)&sliceStr.field_2 + 8),&levelH);
      de::toString<int>((string *)((long)&name.field_2 + 8),(int *)&reference.m_pixels.m_cap);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"Level",(allocator<char> *)(desc.field_2._M_local_buf + 0xf));
      std::operator+(&local_2f0,&local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&sliceStr.field_2 + 8));
      std::operator+(&local_2d0,&local_2f0,"Slice");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     &local_2d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator((allocator<char> *)(desc.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_398,"Level ",&local_399);
      std::operator+(&local_378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&sliceStr.field_2 + 8));
      std::operator+(&local_358,&local_378,", Slice ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     &local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)local_398);
      std::allocator<char>::~allocator(&local_399);
      log = tcu::TestContext::getLog
                      ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
      imageSetName = (char *)std::__cxx11::string::c_str();
      imageSetDesc = (char *)std::__cxx11::string::c_str();
      tcu::Surface::getAccess((PixelBufferAccess *)&local_3c8,(Surface *)&result.m_pixels.m_cap);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_3f0,(Surface *)local_218);
      local_479 = levelH == 0 && (int)reference.m_pixels.m_cap == 0;
      bVar1 = tcu::intThresholdCompare
                        (log,imageSetName,imageSetDesc,&local_3c8,&local_3f0,(UVec4 *)local_244,
                         COMPARE_LOG_ON_ERROR - local_479);
      local_39a = bVar1;
      if (!bVar1) {
        tcu::TestContext::setTestResult
                  ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
        reference.m_pixels.m_cap._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)local_338);
      std::__cxx11::string::~string((string *)local_2b0);
      std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(sliceStr.field_2._M_local_buf + 8));
      tcu::Surface::~Surface((Surface *)local_218);
      tcu::Surface::~Surface((Surface *)&result.m_pixels.m_cap);
      if (!bVar1) break;
    }
    if ((reference.m_pixels.m_cap._7_1_ & 1) == 0) break;
  }
  FboTestUtil::Texture3DShader::~Texture3DShader((Texture3DShader *)local_1a0);
  return;
}

Assistant:

void Texture3DSpecCase::verifyTexture (sglr::GLContext& gles3Context, sglr::ReferenceContext& refContext)
{
	Texture3DShader shader			(glu::getSampler3DType(m_texFormat), glu::TYPE_FLOAT_VEC4);
	deUint32		shaderIDgles	= gles3Context.createProgram(&shader);
	deUint32		shaderIDRef		= refContext.createProgram(&shader);

	shader.setTexScaleBias(m_texFormatInfo.lookupScale, m_texFormatInfo.lookupBias);

	// Set state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		sglr::Context* ctx = ndx ? static_cast<sglr::Context*>(&refContext) : static_cast<sglr::Context*>(&gles3Context);

		setContext(ctx);

		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAX_LEVEL,	m_numLevels-1);
	}

	for (int levelNdx = 0; levelNdx < m_numLevels; levelNdx++)
	{
		int		levelW		= de::max(1, m_width	>> levelNdx);
		int		levelH		= de::max(1, m_height	>> levelNdx);
		int		levelD		= de::max(1, m_depth	>> levelNdx);
		bool	levelOk		= true;

		for (int depth = 0; depth < levelD; depth++)
		{
			tcu::Surface	reference;
			tcu::Surface	result;

			shader.setDepth(((float)depth + 0.5f) / (float)levelD);

			for (int ndx = 0; ndx < 2; ndx++)
			{
				tcu::Surface&	dst			= ndx ? reference									: result;
				sglr::Context*	ctx			= ndx ? static_cast<sglr::Context*>(&refContext)	: static_cast<sglr::Context*>(&gles3Context);
				deUint32		shaderID	= ndx ? shaderIDRef									: shaderIDgles;

				setContext(ctx);
				shader.setUniforms(*ctx, shaderID);
				renderTex(dst, shaderID, levelW, levelH);
			}

			UVec4			threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
			string			levelStr	= de::toString(levelNdx);
			string			sliceStr	= de::toString(depth);
			string			name		= string("Level") + levelStr + "Slice" + sliceStr;
			string			desc		= string("Level ") + levelStr + ", Slice " + sliceStr;
			bool			depthOk		= tcu::intThresholdCompare(m_testCtx.getLog(), name.c_str(), desc.c_str(), reference.getAccess(), result.getAccess(), threshold,
																   (levelNdx == 0 && depth == 0) ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!depthOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				levelOk = false;
				break;
			}
		}

		if (!levelOk)
			break;
	}
}